

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiPartInputFile.cpp
# Opt level: O1

void __thiscall
Imf_2_5::MultiPartInputFile::Data::readChunkOffsetTables
          (Data *this,bool reconstructChunkOffsetTable)

{
  vector<Imf_2_5::InputPartData_*,_std::allocator<Imf_2_5::InputPartData_*>_> *parts;
  InputPartData *pIVar1;
  byte bVar2;
  uint uVar3;
  pointer ppIVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  
  parts = &this->parts;
  ppIVar4 = (this->parts).
            super__Vector_base<Imf_2_5::InputPartData_*,_std::allocator<Imf_2_5::InputPartData_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->parts).
      super__Vector_base<Imf_2_5::InputPartData_*,_std::allocator<Imf_2_5::InputPartData_*>_>.
      _M_impl.super__Vector_impl_data._M_finish == ppIVar4) {
    bVar2 = 0;
  }
  else {
    bVar2 = 0;
    uVar7 = 0;
    do {
      uVar3 = getChunkOffsetTableSize(&ppIVar4[uVar7]->header,false);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                (&(parts->
                  super__Vector_base<Imf_2_5::InputPartData_*,_std::allocator<Imf_2_5::InputPartData_*>_>
                  )._M_impl.super__Vector_impl_data._M_start[uVar7]->chunkOffsets,(long)(int)uVar3);
      if (0 < (int)uVar3) {
        lVar6 = 0;
        do {
          Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>
                    ((this->super_InputStreamMutex).is,
                     (unsigned_long *)
                     (*(long *)&((this->parts).
                                 super__Vector_base<Imf_2_5::InputPartData_*,_std::allocator<Imf_2_5::InputPartData_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar7]->chunkOffsets).
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data + lVar6));
          lVar6 = lVar6 + 8;
        } while ((ulong)uVar3 * 8 - lVar6 != 0);
      }
      pIVar1 = (parts->
               super__Vector_base<Imf_2_5::InputPartData_*,_std::allocator<Imf_2_5::InputPartData_*>_>
               )._M_impl.super__Vector_impl_data._M_start[uVar7];
      pIVar1->completed = true;
      if (0 < (int)uVar3) {
        uVar5 = 0;
        do {
          if (*(long *)(*(long *)&(pIVar1->chunkOffsets).
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data + uVar5 * 8) == 0) {
            pIVar1->completed = false;
            bVar2 = 1;
            break;
          }
          uVar5 = uVar5 + 1;
        } while (uVar3 != uVar5);
      }
      uVar7 = uVar7 + 1;
      ppIVar4 = (this->parts).
                super__Vector_base<Imf_2_5::InputPartData_*,_std::allocator<Imf_2_5::InputPartData_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar7 < (ulong)((long)(this->parts).
                                   super__Vector_base<Imf_2_5::InputPartData_*,_std::allocator<Imf_2_5::InputPartData_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar4 >> 3))
    ;
  }
  if ((bVar2 & reconstructChunkOffsetTable) == 0) {
    return;
  }
  chunkOffsetReconstruction(this,(this->super_InputStreamMutex).is,parts);
  return;
}

Assistant:

void
MultiPartInputFile::Data::readChunkOffsetTables(bool reconstructChunkOffsetTable)
{
    bool brokenPartsExist = false;

    for (size_t i = 0; i < parts.size(); i++)
    {
        int chunkOffsetTableSize = getChunkOffsetTableSize(parts[i]->header);
        parts[i]->chunkOffsets.resize(chunkOffsetTableSize);

        for (int j = 0; j < chunkOffsetTableSize; j++)
            OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::read <OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (*is, parts[i]->chunkOffsets[j]);

        //
        // Check chunk offsets, reconstruct if broken.
        // At first we assume the table is complete.
        //
        parts[i]->completed = true;
        for (int j = 0; j < chunkOffsetTableSize; j++)
        {
            if (parts[i]->chunkOffsets[j] <= 0)
            {
                brokenPartsExist = true;
                parts[i]->completed = false;
                break;
            }
        }
    }

    if (brokenPartsExist && reconstructChunkOffsetTable)
        chunkOffsetReconstruction(*is, parts);
}